

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

AddrInfo * __thiscall AddrManImpl::Find(AddrManImpl *this,CService *addr,int *pnId)

{
  long lVar1;
  iterator iVar2;
  __node_base_ptr p_Var3;
  AddrInfo *pAVar4;
  _Hash_node_base *p_Var5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = std::
          _Hashtable<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->mapAddr)._M_h,addr);
  if (iVar2.super__Node_iterator_base<std::pair<const_CService,_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    pAVar4 = (AddrInfo *)0x0;
  }
  else {
    if (pnId != (int *)0x0) {
      *pnId = *(int *)((long)iVar2.super__Node_iterator_base<std::pair<const_CService,_int>,_false>.
                             _M_cur + 0x30);
    }
    p_Var5 = (_Hash_node_base *)0x0;
    p_Var3 = std::
             _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->mapInfo)._M_h,
                        (ulong)(long)*(int *)((long)iVar2.
                                                  super__Node_iterator_base<std::pair<const_CService,_int>,_false>
                                                  ._M_cur + 0x30) %
                        (this->mapInfo)._M_h._M_bucket_count,
                        (key_type_conflict2 *)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_CService,_int>,_false>.
                               _M_cur + 0x30),
                        (long)*(int *)((long)iVar2.
                                             super__Node_iterator_base<std::pair<const_CService,_int>,_false>
                                             ._M_cur + 0x30));
    if (p_Var3 != (__node_base_ptr)0x0) {
      p_Var5 = p_Var3->_M_nxt;
    }
    pAVar4 = (AddrInfo *)(p_Var5 + 2);
    if (p_Var5 == (_Hash_node_base *)0x0) {
      pAVar4 = (AddrInfo *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pAVar4;
}

Assistant:

AddrInfo* AddrManImpl::Find(const CService& addr, int* pnId)
{
    AssertLockHeld(cs);

    const auto it = mapAddr.find(addr);
    if (it == mapAddr.end())
        return nullptr;
    if (pnId)
        *pnId = (*it).second;
    const auto it2 = mapInfo.find((*it).second);
    if (it2 != mapInfo.end())
        return &(*it2).second;
    return nullptr;
}